

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int VP8LDecodeHeader(VP8LDecoder *dec,VP8Io *io)

{
  int iVar1;
  VP8Io *in_RSI;
  VP8LDecoder *in_RDI;
  int has_alpha;
  int height;
  int width;
  VP8LDecoder *in_stack_00000020;
  int in_stack_0000002c;
  int in_stack_00000030;
  int in_stack_00000034;
  int *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_4;
  
  if (in_RDI == (VP8LDecoder *)0x0) {
    local_4 = 0;
  }
  else if (in_RSI == (VP8Io *)0x0) {
    local_4 = VP8LSetError(in_RDI,VP8_STATUS_INVALID_PARAM);
  }
  else {
    in_RDI->io_ = in_RSI;
    in_RDI->status_ = VP8_STATUS_OK;
    VP8LInitBitReader(&in_RDI->br_,in_RSI->data,in_RSI->data_size);
    iVar1 = ReadImageInfo((VP8LBitReader *)in_RSI,
                          (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8,(int *)0x10f919);
    if (iVar1 == 0) {
      VP8LSetError(in_RDI,VP8_STATUS_BITSTREAM_ERROR);
    }
    else {
      in_RDI->state_ = READ_DIM;
      in_RSI->width = in_stack_ffffffffffffffe4;
      in_RSI->height = in_stack_ffffffffffffffe0;
      iVar1 = DecodeImageStream(in_stack_00000034,in_stack_00000030,in_stack_0000002c,
                                in_stack_00000020,(uint32_t **)dec);
      if (iVar1 != 0) {
        return 1;
      }
    }
    VP8LClear((VP8LDecoder *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int VP8LDecodeHeader(VP8LDecoder* const dec, VP8Io* const io) {
  int width, height, has_alpha;

  if (dec == NULL) return 0;
  if (io == NULL) {
    return VP8LSetError(dec, VP8_STATUS_INVALID_PARAM);
  }

  dec->io_ = io;
  dec->status_ = VP8_STATUS_OK;
  VP8LInitBitReader(&dec->br_, io->data, io->data_size);
  if (!ReadImageInfo(&dec->br_, &width, &height, &has_alpha)) {
    VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
    goto Error;
  }
  dec->state_ = READ_DIM;
  io->width = width;
  io->height = height;

  if (!DecodeImageStream(width, height, /*is_level0=*/1, dec,
                         /*decoded_data=*/NULL)) {
    goto Error;
  }
  return 1;

 Error:
  VP8LClear(dec);
  assert(dec->status_ != VP8_STATUS_OK);
  return 0;
}